

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O1

void test_bson_append_int32(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  bson_t *pbVar4;
  char *pcVar5;
  bson_t *pbVar6;
  bson_t *b;
  char *pcVar7;
  undefined8 uVar8;
  uint uVar9;
  code *pcVar10;
  code **ppcVar11;
  code **__haystack;
  char *unaff_R12;
  long *plVar12;
  undefined1 *unaff_R13;
  undefined1 *puVar13;
  undefined1 *puVar14;
  char *pcVar15;
  long lStack_1040;
  int iStack_1034;
  undefined1 auStack_1030 [8];
  char *pcStack_1028;
  undefined4 uStack_1020;
  undefined4 uStack_101c;
  undefined2 uStack_1018;
  undefined2 uStack_1016;
  undefined4 uStack_1014;
  undefined2 uStack_1010;
  undefined8 uStack_100e;
  undefined1 auStack_1000 [128];
  undefined1 auStack_f80 [368];
  undefined1 *puStack_e10;
  code *pcStack_e08;
  long lStack_d98;
  undefined7 uStack_d90;
  char cStack_d89;
  undefined1 uStack_d88;
  undefined1 auStack_d80 [128];
  undefined1 auStack_d00 [376];
  code *apcStack_b88 [16];
  undefined1 auStack_b08 [8];
  undefined1 auStack_b00 [128];
  undefined1 auStack_a80 [128];
  undefined1 auStack_a00 [272];
  undefined8 uStack_8f0;
  char *pcStack_8e8;
  char *pcStack_8e0;
  bson_t *pbStack_8d8;
  undefined8 uStack_8d0;
  char *pcStack_8c8;
  char *pcStack_8c0;
  bson_t *pbStack_8b8;
  long *plStack_8b0;
  bson_t *pbStack_8a8;
  bson_t *pbStack_8a0;
  char *pcStack_898;
  code *apcStack_890 [2];
  long lStack_880;
  int iStack_878;
  int iStack_874;
  undefined1 auStack_870 [504];
  char acStack_678 [72];
  bson_t *pbStack_630;
  char *pcStack_628;
  undefined1 *puStack_620;
  char *pcStack_618;
  bson_t *pbStack_610;
  code *pcStack_608;
  int iStack_58c;
  undefined1 auStack_588 [8];
  undefined1 auStack_580 [248];
  bson_t *pbStack_488;
  code *apcStack_480 [2];
  bson_t *pbStack_470;
  bson_t *pbStack_468;
  bson_t *pbStack_460;
  code *pcStack_458;
  undefined8 uStack_450;
  undefined4 uStack_448;
  bson_t *pbStack_440;
  undefined1 *puStack_438;
  code *pcStack_430;
  bson_t *pbStack_420;
  code *pcStack_418;
  undefined1 auStack_410 [32];
  bson_t *apbStack_3f0 [2];
  bson_t *pbStack_3e0;
  bson_t *apbStack_3d8 [2];
  bson_t *pbStack_3c8;
  bson_t *apbStack_3c0 [2];
  bson_t *pbStack_3b0;
  bson_t *apbStack_3a8 [2];
  bson_t *pbStack_398;
  code *pcStack_390;
  bson_t *pbStack_380;
  code *pcStack_378;
  undefined1 auStack_364 [12];
  bson_t *pbStack_358;
  code *pcStack_350;
  bson_t *pbStack_340;
  code *pcStack_338;
  bson_t *pbStack_328;
  code *pcStack_320;
  char *pcStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [128];
  undefined1 auStack_280 [128];
  char acStack_200 [376];
  bson_t *pbStack_88;
  undefined8 uStack_50;
  undefined8 uStack_48;
  bson_t *pbStack_40;
  
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_int32(pbVar3,"a",0xffffffff,0xffffff85);
  if (cVar1 == '\0') {
    test_bson_append_int32_cold_1();
LAB_00121b7a:
    test_bson_append_int32_cold_2();
  }
  else {
    cVar1 = bson_append_int32(pbVar3,"c",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_00121b7a;
    cVar1 = bson_append_int32(pbVar3,"b",0xffffffff,0x7b);
    if (cVar1 != '\0') {
      pbVar4 = get_bson("test33.bson");
      BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  test_bson_append_int32_cold_3();
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_int64(pbVar3,"a",0xffffffff,100000000000000);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test34.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_int64_cold_1();
  uStack_48 = 0;
  uStack_50 = 1;
  pbStack_40 = pbVar3;
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_decimal128(pbVar3,"a",0xffffffff,&uStack_50);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test58.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_decimal128_cold_1();
  puVar13 = auStack_300;
  puVar14 = auStack_300;
  pcVar15 = acStack_200;
  pcStack_308 = (code *)0x121c85;
  pbStack_88 = pbVar3;
  bson_init(pcVar15);
  pbVar3 = (bson_t *)0x14a6aa;
  pcStack_308 = (code *)0x121ca1;
  bson_append_int32(pcVar15,"a",1,1);
  pcStack_308 = (code *)0x121cba;
  bson_append_int32(pcVar15,"b",1,2);
  pcStack_308 = (code *)0x121cd3;
  bson_append_int32(pcVar15,"c",1,3);
  pcStack_308 = (code *)0x121cf7;
  bson_append_utf8(pcVar15,"d",1,"hello",5);
  pcStack_308 = (code *)0x121d04;
  bson_init(auStack_280);
  pcStack_308 = (code *)0x121d12;
  cVar1 = bson_iter_init_find(auStack_300,pcVar15,"a");
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x121f34;
    test_bson_append_iter_cold_1();
LAB_00121f34:
    pcStack_308 = (code *)0x121f39;
    test_bson_append_iter_cold_2();
LAB_00121f39:
    pcStack_308 = (code *)0x121f3e;
    test_bson_append_iter_cold_3();
LAB_00121f3e:
    pcStack_308 = (code *)0x121f43;
    test_bson_append_iter_cold_4();
LAB_00121f43:
    pcStack_308 = (code *)0x121f48;
    test_bson_append_iter_cold_5();
LAB_00121f48:
    pcStack_308 = (code *)0x121f4d;
    test_bson_append_iter_cold_6();
LAB_00121f4d:
    pcStack_308 = (code *)0x121f52;
    test_bson_append_iter_cold_7();
LAB_00121f52:
    pcStack_308 = (code *)0x121f57;
    test_bson_append_iter_cold_11();
    puVar13 = unaff_R13;
LAB_00121f57:
    pcStack_308 = (code *)0x121f5c;
    test_bson_append_iter_cold_15();
LAB_00121f5c:
    pcStack_308 = (code *)0x121f61;
    test_bson_append_iter_cold_9();
LAB_00121f61:
    pcStack_308 = (code *)0x121f66;
    test_bson_append_iter_cold_10();
LAB_00121f66:
    pcStack_308 = (code *)0x121f6b;
    test_bson_append_iter_cold_13();
LAB_00121f6b:
    pcStack_308 = (code *)0x121f70;
    test_bson_append_iter_cold_14();
    puVar14 = puVar13;
LAB_00121f70:
    pcStack_308 = (code *)0x121f75;
    test_bson_append_iter_cold_16();
LAB_00121f75:
    pcStack_308 = (code *)0x121f7d;
    test_bson_append_iter_cold_8();
LAB_00121f7d:
    pcStack_308 = (code *)0x121f85;
    test_bson_append_iter_cold_12();
LAB_00121f85:
    pcStack_308 = (code *)0x121f8d;
    test_bson_append_iter_cold_17();
  }
  else {
    pcStack_308 = (code *)0x121d2e;
    cVar1 = bson_append_iter(auStack_280,0,0,auStack_300);
    if (cVar1 == '\0') goto LAB_00121f34;
    unaff_R12 = "c";
    pcStack_308 = (code *)0x121d50;
    cVar1 = bson_iter_init_find(auStack_300,acStack_200,"c");
    if (cVar1 == '\0') goto LAB_00121f39;
    pcStack_308 = (code *)0x121d6c;
    cVar1 = bson_append_iter(auStack_280,0,0,auStack_300);
    if (cVar1 == '\0') goto LAB_00121f3e;
    pcStack_308 = (code *)0x121d8b;
    cVar1 = bson_iter_init_find(auStack_300,acStack_200,"d");
    if (cVar1 == '\0') goto LAB_00121f43;
    pcVar15 = "world";
    pcStack_308 = (code *)0x121db2;
    cVar1 = bson_append_iter(auStack_280,"world",0xffffffff,auStack_300);
    if (cVar1 == '\0') goto LAB_00121f48;
    pcStack_308 = (code *)0x121dcd;
    bson_iter_init(auStack_300,auStack_280);
    pcStack_308 = (code *)0x121dd5;
    cVar1 = bson_iter_next(auStack_300);
    unaff_R13 = auStack_300;
    if (cVar1 == '\0') goto LAB_00121f4d;
    pcStack_308 = (code *)0x121de5;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    if (pcVar5 != "a") {
      pcStack_308 = (code *)0x121df2;
      pcVar5 = (char *)bson_iter_key(auStack_300);
      pcStack_308 = (code *)0x121e01;
      iVar2 = strcmp("a",pcVar5);
      if (iVar2 == 0) goto LAB_00121e09;
      goto LAB_00121f75;
    }
LAB_00121e09:
    pcStack_308 = (code *)0x121e11;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x10) goto LAB_00121f5c;
    pcStack_308 = (code *)0x121e22;
    iVar2 = bson_iter_int32(auStack_300);
    puVar13 = auStack_300;
    if (iVar2 != 1) goto LAB_00121f61;
    pcStack_308 = (code *)0x121e33;
    cVar1 = bson_iter_next(auStack_300);
    unaff_R13 = auStack_300;
    if (cVar1 == '\0') goto LAB_00121f52;
    pcStack_308 = (code *)0x121e43;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    if (pcVar5 != "c") {
      pcStack_308 = (code *)0x121e50;
      pcVar5 = (char *)bson_iter_key(auStack_300);
      pcStack_308 = (code *)0x121e5f;
      iVar2 = strcmp("c",pcVar5);
      puVar14 = auStack_300;
      if (iVar2 == 0) goto LAB_00121e67;
      goto LAB_00121f7d;
    }
LAB_00121e67:
    pcStack_308 = (code *)0x121e6f;
    iVar2 = bson_iter_type(auStack_300);
    puVar13 = auStack_300;
    if (iVar2 != 0x10) goto LAB_00121f66;
    pcStack_308 = (code *)0x121e80;
    iVar2 = bson_iter_int32(auStack_300);
    puVar13 = auStack_300;
    if (iVar2 != 3) goto LAB_00121f6b;
    pcStack_308 = (code *)0x121e91;
    cVar1 = bson_iter_next(auStack_300);
    puVar13 = auStack_300;
    if (cVar1 == '\0') goto LAB_00121f57;
    pcStack_308 = (code *)0x121ea1;
    iVar2 = bson_iter_type(auStack_300);
    puVar14 = auStack_300;
    if (iVar2 != 2) goto LAB_00121f70;
    pcStack_308 = (code *)0x121eb2;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    if (pcVar5 != "world") {
      pcStack_308 = (code *)0x121ebf;
      pcVar5 = (char *)bson_iter_key(auStack_300);
      pcStack_308 = (code *)0x121ece;
      iVar2 = strcmp("world",pcVar5);
      puVar14 = auStack_300;
      if (iVar2 == 0) goto LAB_00121ed6;
      goto LAB_00121f85;
    }
LAB_00121ed6:
    pcStack_308 = (code *)0x121ee0;
    pcVar5 = (char *)bson_iter_utf8(auStack_300,0);
    if (pcVar5 == "hello") {
LAB_00121f06:
      pcStack_308 = (code *)0x121f13;
      bson_destroy(acStack_200);
      pcStack_308 = (code *)0x121f20;
      bson_destroy(auStack_280);
      return;
    }
    pcStack_308 = (code *)0x121eef;
    pcVar5 = (char *)bson_iter_utf8(auStack_300,0);
    pcStack_308 = (code *)0x121efe;
    iVar2 = strcmp("hello",pcVar5);
    puVar14 = auStack_300;
    if (iVar2 == 0) goto LAB_00121f06;
  }
  pcStack_308 = test_bson_append_maxkey;
  test_bson_append_iter_cold_18();
  pcStack_310 = "hello";
  pcStack_320 = (code *)0x121f9e;
  pcStack_308 = (code *)pcVar15;
  pbVar4 = (bson_t *)bson_new();
  pcStack_320 = (code *)0x121fb5;
  cVar1 = bson_append_maxkey(pbVar4,"maxkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_320 = (code *)0x121fc5;
    pbVar3 = get_bson("test37.bson");
    pcStack_320 = (code *)0x121fd3;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_320 = (code *)0x121fdb;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_320 = test_bson_append_minkey;
  test_bson_append_maxkey_cold_1();
  pcStack_338 = (code *)0x121ff8;
  pbStack_328 = pbVar4;
  pcStack_320 = (code *)pcVar15;
  pbVar4 = (bson_t *)bson_new();
  pcStack_338 = (code *)0x12200f;
  cVar1 = bson_append_minkey(pbVar4,"minkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_338 = (code *)0x12201f;
    pbVar3 = get_bson("test36.bson");
    pcStack_338 = (code *)0x12202d;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_338 = (code *)0x122035;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_338 = test_bson_append_null;
  test_bson_append_minkey_cold_1();
  pcStack_350 = (code *)0x122052;
  pbStack_340 = pbVar4;
  pcStack_338 = (code *)pcVar15;
  pbVar4 = (bson_t *)bson_new();
  pcStack_350 = (code *)0x122069;
  cVar1 = bson_append_null(pbVar4,"hello",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_350 = (code *)0x122079;
    pbVar3 = get_bson("test18.bson");
    pcStack_350 = (code *)0x122087;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_350 = (code *)0x12208f;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_350 = test_bson_append_oid;
  test_bson_append_null_cold_1();
  pcStack_378 = (code *)0x1220be;
  pbStack_358 = pbVar4;
  pcStack_350 = (code *)pcVar15;
  bson_oid_init_from_string(auStack_364,"1234567890abcdef1234abcd");
  pcStack_378 = (code *)0x1220c3;
  pbVar4 = (bson_t *)bson_new();
  pcStack_378 = (code *)0x1220dd;
  cVar1 = bson_append_oid(pbVar4,"oid",0xffffffff,auStack_364);
  if (cVar1 != '\0') {
    pcStack_378 = (code *)0x1220ed;
    pbVar3 = get_bson("test22.bson");
    pcStack_378 = (code *)0x1220fb;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_378 = (code *)0x122103;
    bson_destroy(pbVar4);
    pcStack_378 = (code *)0x12210b;
    bson_destroy(pbVar3);
    return;
  }
  pcStack_378 = test_bson_append_regex;
  test_bson_append_oid_cold_1();
  pcStack_390 = (code *)0x122121;
  pbStack_380 = pbVar4;
  pcStack_378 = (code *)auStack_364;
  pbVar4 = (bson_t *)bson_new();
  pcStack_390 = (code *)0x122146;
  cVar1 = bson_append_regex(pbVar4,"regex",0xffffffff,"^abcd","ilx");
  if (cVar1 != '\0') {
    pcStack_390 = (code *)0x122156;
    pbVar3 = get_bson("test27.bson");
    pcStack_390 = (code *)0x122164;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_390 = (code *)0x12216c;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_390 = test_bson_append_utf8;
  test_bson_append_regex_cold_1();
  apbStack_3a8[0] = (bson_t *)0x122189;
  pbStack_398 = pbVar4;
  pcStack_390 = (code *)auStack_364;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3a8[0] = (bson_t *)0x122198;
  pbVar6 = get_bson("test11.bson");
  apbStack_3a8[0] = (bson_t *)0x1221bc;
  cVar1 = bson_append_utf8(pbVar4,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_3a8[0] = (bson_t *)0x1221cb;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar6);
    apbStack_3a8[0] = (bson_t *)0x1221d3;
    bson_destroy(pbVar4);
    bson_destroy(pbVar6);
    return;
  }
  apbStack_3a8[0] = (bson_t *)test_bson_append_symbol;
  test_bson_append_utf8_cold_1();
  apbStack_3c0[0] = (bson_t *)0x1221f0;
  pbStack_3b0 = pbVar4;
  apbStack_3a8[0] = pbVar6;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3c0[0] = (bson_t *)0x1221ff;
  pbVar6 = get_bson("test32.bson");
  apbStack_3c0[0] = (bson_t *)0x122223;
  cVar1 = bson_append_symbol(pbVar4,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_3c0[0] = (bson_t *)0x122232;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar6);
    apbStack_3c0[0] = (bson_t *)0x12223a;
    bson_destroy(pbVar4);
    bson_destroy(pbVar6);
    return;
  }
  apbStack_3c0[0] = (bson_t *)test_bson_append_time_t;
  test_bson_append_symbol_cold_1();
  apbStack_3d8[0] = (bson_t *)0x122257;
  pbStack_3c8 = pbVar4;
  apbStack_3c0[0] = pbVar6;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3d8[0] = (bson_t *)0x122273;
  cVar1 = bson_append_time_t(pbVar4,"time_t",0xffffffff,0x499602d2);
  if (cVar1 != '\0') {
    apbStack_3d8[0] = (bson_t *)0x122283;
    pbVar3 = get_bson("test26.bson");
    apbStack_3d8[0] = (bson_t *)0x122291;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    apbStack_3d8[0] = (bson_t *)0x122299;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  apbStack_3d8[0] = (bson_t *)test_bson_append_timestamp;
  test_bson_append_time_t_cold_1();
  apbStack_3f0[0] = (bson_t *)0x1222b6;
  pbStack_3e0 = pbVar4;
  apbStack_3d8[0] = pbVar6;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3f0[0] = (bson_t *)0x1222d8;
  cVar1 = bson_append_timestamp(pbVar4,"timestamp",0xffffffff,0x4d2,0x2694);
  if (cVar1 != '\0') {
    apbStack_3f0[0] = (bson_t *)0x1222e8;
    pbVar3 = get_bson("test35.bson");
    apbStack_3f0[0] = (bson_t *)0x1222f6;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    apbStack_3f0[0] = (bson_t *)0x1222fe;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  apbStack_3f0[0] = (bson_t *)test_bson_append_timeval;
  test_bson_append_timestamp_cold_1();
  b = (bson_t *)auStack_410;
  auStack_410._0_4_ = 0x499602d2;
  auStack_410._4_4_ = 0;
  auStack_410[8] = '\0';
  auStack_410[9] = '\0';
  auStack_410[10] = '\0';
  auStack_410[0xb] = '\0';
  auStack_410[0xc] = '\0';
  auStack_410[0xd] = '\0';
  auStack_410[0xe] = '\0';
  auStack_410[0xf] = '\0';
  pcStack_418 = (code *)0x122337;
  auStack_410._24_8_ = pbVar4;
  apbStack_3f0[0] = pbVar6;
  pbVar4 = (bson_t *)bson_new();
  pcStack_418 = (code *)0x122351;
  cVar1 = bson_append_timeval(pbVar4,"time_t",0xffffffff,auStack_410);
  if (cVar1 != '\0') {
    pcStack_418 = (code *)0x122361;
    pbVar3 = get_bson("test26.bson");
    pcStack_418 = (code *)0x12236f;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_418 = (code *)0x122377;
    bson_destroy(pbVar4);
    pcStack_418 = (code *)0x12237f;
    bson_destroy(pbVar3);
    return;
  }
  pcStack_418 = test_bson_append_undefined;
  test_bson_append_timeval_cold_1();
  pcStack_430 = (code *)0x122395;
  pbStack_420 = pbVar4;
  pcStack_418 = (code *)auStack_410;
  pbVar4 = (bson_t *)bson_new();
  pcStack_430 = (code *)0x1223ac;
  cVar1 = bson_append_undefined(pbVar4,"undefined",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_430 = (code *)0x1223bc;
    pbVar3 = get_bson("test25.bson");
    pcStack_430 = (code *)0x1223ca;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_430 = (code *)0x1223d2;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_430 = test_bson_append_general;
  test_bson_append_undefined_cold_1();
  pcStack_430 = (code *)0x14a6aa;
  pcStack_458 = (code *)0x1223f4;
  pbStack_440 = pbVar4;
  puStack_438 = auStack_410;
  pbVar4 = (bson_t *)bson_new();
  pcStack_458 = (code *)0x122410;
  cVar1 = bson_append_int32(pbVar4,"int",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_458 = (code *)0x122c2c;
    test_bson_append_general_cold_1();
LAB_00122c2c:
    pcStack_458 = (code *)0x122c31;
    test_bson_append_general_cold_2();
LAB_00122c31:
    pcStack_458 = (code *)0x122c36;
    test_bson_append_general_cold_3();
LAB_00122c36:
    pcStack_458 = (code *)0x122c3b;
    test_bson_append_general_cold_4();
LAB_00122c3b:
    pcStack_458 = (code *)0x122c40;
    test_bson_append_general_cold_5();
LAB_00122c40:
    pcStack_458 = (code *)0x122c45;
    test_bson_append_general_cold_6();
LAB_00122c45:
    pcStack_458 = (code *)0x122c4a;
    test_bson_append_general_cold_7();
LAB_00122c4a:
    pcStack_458 = (code *)0x122c4f;
    test_bson_append_general_cold_8();
LAB_00122c4f:
    pcStack_458 = (code *)0x122c54;
    test_bson_append_general_cold_9();
LAB_00122c54:
    pcStack_458 = (code *)0x122c59;
    test_bson_append_general_cold_10();
LAB_00122c59:
    pcStack_458 = (code *)0x122c5e;
    test_bson_append_general_cold_11();
LAB_00122c5e:
    pcStack_458 = (code *)0x122c63;
    test_bson_append_general_cold_12();
LAB_00122c63:
    pcStack_458 = (code *)0x122c68;
    test_bson_append_general_cold_13();
LAB_00122c68:
    pcStack_458 = (code *)0x122c6d;
    test_bson_append_general_cold_14();
LAB_00122c6d:
    pcStack_458 = (code *)0x122c72;
    test_bson_append_general_cold_15();
LAB_00122c72:
    pcStack_458 = (code *)0x122c77;
    test_bson_append_general_cold_16();
LAB_00122c77:
    pcStack_458 = (code *)0x122c7c;
    test_bson_append_general_cold_17();
LAB_00122c7c:
    pcStack_458 = (code *)0x122c81;
    test_bson_append_general_cold_18();
LAB_00122c81:
    pcStack_458 = (code *)0x122c86;
    test_bson_append_general_cold_19();
LAB_00122c86:
    pcStack_458 = (code *)0x122c8b;
    test_bson_append_general_cold_20();
LAB_00122c8b:
    pcStack_458 = (code *)0x122c90;
    test_bson_append_general_cold_21();
LAB_00122c90:
    pcStack_458 = (code *)0x122c95;
    test_bson_append_general_cold_22();
LAB_00122c95:
    pcStack_458 = (code *)0x122c9a;
    test_bson_append_general_cold_23();
LAB_00122c9a:
    pcStack_458 = (code *)0x122c9f;
    test_bson_append_general_cold_24();
LAB_00122c9f:
    pcStack_458 = (code *)0x122ca4;
    test_bson_append_general_cold_25();
LAB_00122ca4:
    pcStack_458 = (code *)0x122ca9;
    test_bson_append_general_cold_26();
LAB_00122ca9:
    pcStack_458 = (code *)0x122cae;
    test_bson_append_general_cold_27();
LAB_00122cae:
    pcStack_458 = (code *)0x122cb3;
    test_bson_append_general_cold_28();
LAB_00122cb3:
    pcStack_458 = (code *)0x122cb8;
    test_bson_append_general_cold_29();
LAB_00122cb8:
    pcStack_458 = (code *)0x122cbd;
    test_bson_append_general_cold_30();
LAB_00122cbd:
    pcStack_458 = (code *)0x122cc2;
    test_bson_append_general_cold_31();
LAB_00122cc2:
    pcStack_458 = (code *)0x122cc7;
    test_bson_append_general_cold_32();
LAB_00122cc7:
    pcStack_458 = (code *)0x122ccc;
    test_bson_append_general_cold_33();
LAB_00122ccc:
    pcStack_458 = (code *)0x122cd1;
    test_bson_append_general_cold_34();
LAB_00122cd1:
    pcStack_458 = (code *)0x122cd6;
    test_bson_append_general_cold_35();
LAB_00122cd6:
    pcStack_458 = (code *)0x122cdb;
    test_bson_append_general_cold_36();
LAB_00122cdb:
    pcStack_458 = (code *)0x122ce0;
    test_bson_append_general_cold_37();
  }
  else {
    pcStack_458 = (code *)0x122424;
    b = get_bson("test1.bson");
    pcStack_458 = (code *)0x122432;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x12243a;
    bson_destroy(b);
    pcStack_458 = (code *)0x122442;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122447;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122463;
    cVar1 = bson_append_int64(pbVar4,"int64",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c2c;
    pcStack_458 = (code *)0x122477;
    b = get_bson("test2.bson");
    pcStack_458 = (code *)0x122485;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x12248d;
    bson_destroy(b);
    pcStack_458 = (code *)0x122495;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x12249a;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1224b9;
    cVar1 = bson_append_double(0xd916872b,pbVar4,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c31;
    pcStack_458 = (code *)0x1224cd;
    b = get_bson("test3.bson");
    pcStack_458 = (code *)0x1224db;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x1224e3;
    bson_destroy(b);
    pcStack_458 = (code *)0x1224eb;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1224f0;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122514;
    cVar1 = bson_append_utf8(pbVar4,"string",0xffffffff,"some string",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c36;
    pcStack_458 = (code *)0x122528;
    pbVar6 = get_bson("test5.bson");
    pcStack_458 = (code *)0x122536;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar6);
    pcStack_458 = (code *)0x12253e;
    bson_destroy(pbVar6);
    pcStack_458 = (code *)0x122546;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x12254b;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122553;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x12256f;
    cVar1 = bson_append_int32(b,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c3b;
    pcStack_458 = (code *)0x122590;
    cVar1 = bson_append_int32(b,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_00122c40;
    pcStack_458 = (code *)0x1225b1;
    cVar1 = bson_append_int32(b,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_00122c45;
    pcStack_458 = (code *)0x1225d2;
    cVar1 = bson_append_int32(b,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_00122c4a;
    pcStack_458 = (code *)0x1225f3;
    cVar1 = bson_append_int32(b,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_00122c4f;
    pcStack_458 = (code *)0x122614;
    cVar1 = bson_append_int32(b,"5",0xffffffff,6);
    if (cVar1 == '\0') goto LAB_00122c54;
    pcStack_458 = (code *)0x122633;
    cVar1 = bson_append_array(pbVar4,"array[int]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c59;
    pcStack_458 = (code *)0x122647;
    pbVar3 = get_bson("test6.bson");
    pcStack_458 = (code *)0x122655;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_458 = (code *)0x12265d;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122665;
    bson_destroy(b);
    pcStack_458 = (code *)0x12266d;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122672;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x12267a;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122699;
    cVar1 = bson_append_double(0xd916872b,b,"0",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c5e;
    pcStack_458 = (code *)0x1226bd;
    cVar1 = bson_append_double(0x6c8b4396,b,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c63;
    pcStack_458 = (code *)0x1226dc;
    cVar1 = bson_append_array(pbVar4,"array[double]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c68;
    pcStack_458 = (code *)0x1226f0;
    pbVar3 = get_bson("test7.bson");
    pcStack_458 = (code *)0x1226fe;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_458 = (code *)0x122706;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x12270e;
    bson_destroy(b);
    pcStack_458 = (code *)0x122716;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x12271b;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122723;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x12273f;
    cVar1 = bson_append_int32(b,"int",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c6d;
    pcStack_458 = (code *)0x12275e;
    cVar1 = bson_append_document(pbVar4,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c72;
    pcStack_458 = (code *)0x122772;
    pbVar3 = get_bson("test8.bson");
    pcStack_458 = (code *)0x122780;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_458 = (code *)0x122788;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122790;
    bson_destroy(b);
    pcStack_458 = (code *)0x122798;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x12279d;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1227b4;
    cVar1 = bson_append_null(pbVar4,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c77;
    pcStack_458 = (code *)0x1227c8;
    b = get_bson("test9.bson");
    pcStack_458 = (code *)0x1227d6;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x1227de;
    bson_destroy(b);
    pcStack_458 = (code *)0x1227e6;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1227eb;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122810;
    cVar1 = bson_append_regex(pbVar4,"regex",0xffffffff,"1234","i");
    if (cVar1 == '\0') goto LAB_00122c7c;
    pcStack_458 = (code *)0x122824;
    b = get_bson("test10.bson");
    pcStack_458 = (code *)0x122832;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x12283a;
    bson_destroy(b);
    pcStack_458 = (code *)0x122842;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122847;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x12286b;
    cVar1 = bson_append_utf8(pbVar4,"hello",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c81;
    pcStack_458 = (code *)0x12287f;
    pbVar6 = get_bson("test11.bson");
    pcStack_458 = (code *)0x12288d;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar6);
    pcStack_458 = (code *)0x122895;
    bson_destroy(pbVar6);
    pcStack_458 = (code *)0x12289d;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1228a2;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1228aa;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1228ce;
    cVar1 = bson_append_utf8(pbVar4,"0",0xffffffff,"awesome",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c86;
    pcStack_458 = (code *)0x1228f2;
    cVar1 = bson_append_double(0x33333333,pbVar4,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c8b;
    pcStack_458 = (code *)0x122913;
    cVar1 = bson_append_int32(pbVar4,"2",0xffffffff,0x7c2);
    if (cVar1 == '\0') goto LAB_00122c90;
    pcStack_458 = (code *)0x122932;
    cVar1 = bson_append_array(b,"BSON",0xffffffff,pbVar4);
    if (cVar1 == '\0') goto LAB_00122c95;
    pcStack_458 = (code *)0x122946;
    pbVar3 = get_bson("test12.bson");
    pcStack_458 = (code *)0x122954;
    BSON_ASSERT_BSON_EQUAL(b,pbVar3);
    pcStack_458 = (code *)0x12295c;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122964;
    bson_destroy(b);
    pcStack_458 = (code *)0x12296c;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122971;
    pbVar4 = (bson_t *)bson_new();
    uStack_450 = 0;
    uStack_448 = 0x45230100;
    pcStack_458 = (code *)0x122999;
    cVar1 = bson_append_oid(pbVar4,"_id",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c9a;
    pcStack_458 = (code *)0x1229a6;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1229c0;
    cVar1 = bson_append_oid(b,"_id",0xffffffff,&uStack_450);
    if (cVar1 == '\0') goto LAB_00122c9f;
    pcStack_458 = (code *)0x1229cd;
    pbVar3 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1229f1;
    cVar1 = bson_append_utf8(pbVar3,"0",0xffffffff,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122ca4;
    pcStack_458 = (code *)0x122a1a;
    cVar1 = bson_append_utf8(pbVar3,"1",0xffffffff,"2",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122ca9;
    pcStack_458 = (code *)0x122a43;
    cVar1 = bson_append_utf8(pbVar3,"2",0xffffffff,"3",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cae;
    pcStack_458 = (code *)0x122a6c;
    cVar1 = bson_append_utf8(pbVar3,"3",0xffffffff,"4",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cb3;
    pcStack_458 = (code *)0x122a8b;
    cVar1 = bson_append_array(b,"tags",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122cb8;
    pcStack_458 = (code *)0x122a9b;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122abc;
    cVar1 = bson_append_utf8(b,"text",0xffffffff,"asdfanother",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cbd;
    pcStack_458 = (code *)0x122ac9;
    pbVar3 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122aed;
    cVar1 = bson_append_utf8(pbVar3,"name",0xffffffff,"blah",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cc2;
    pcStack_458 = (code *)0x122b0c;
    cVar1 = bson_append_document(b,"source",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122cc7;
    pcStack_458 = (code *)0x122b1c;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122b33;
    cVar1 = bson_append_document(pbVar4,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122ccc;
    pcStack_458 = (code *)0x122b43;
    bson_destroy(b);
    pcStack_458 = (code *)0x122b48;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122b6c;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"source",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cd1;
    pcStack_458 = (code *)0x122b8b;
    cVar1 = bson_append_array(pbVar4,"type",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122cd6;
    pcStack_458 = (code *)0x122b9b;
    bson_destroy(b);
    pcStack_458 = (code *)0x122ba0;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122bc4;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"server_created_at",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cdb;
    pcStack_458 = (code *)0x122be3;
    cVar1 = bson_append_array(pbVar4,"missing",0xffffffff,b);
    if (cVar1 != '\0') {
      pcStack_458 = (code *)0x122bf3;
      bson_destroy(b);
      pcStack_458 = (code *)0x122bff;
      pbVar3 = get_bson("test17.bson");
      pcStack_458 = (code *)0x122c0d;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      pcStack_458 = (code *)0x122c15;
      bson_destroy(pbVar3);
      pcStack_458 = (code *)0x122c1d;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_458 = test_bson_append_deep;
  test_bson_append_general_cold_38();
  pcVar10 = (code *)0x64;
  apcStack_480[0] = (code *)0x122cf6;
  pbStack_470 = pbVar4;
  pbStack_468 = b;
  pbStack_460 = pbVar3;
  pcStack_458 = (code *)&stack0xffffffffffffffa0;
  pbVar3 = (bson_t *)bson_new();
  while( true ) {
    apcStack_480[0] = (code *)0x122d05;
    pbVar4 = (bson_t *)bson_new();
    apcStack_480[0] = (code *)0x122d1b;
    cVar1 = bson_append_document(pbVar4,"a",0xffffffff,pbVar3);
    if (cVar1 == '\0') break;
    apcStack_480[0] = (code *)0x122d27;
    bson_destroy(pbVar3);
    uVar9 = (int)pcVar10 - 1;
    pcVar10 = (code *)(ulong)uVar9;
    pbVar3 = pbVar4;
    if (uVar9 == 0) {
      apcStack_480[0] = (code *)0x122d3a;
      pbVar3 = get_bson("test38.bson");
      apcStack_480[0] = (code *)0x122d48;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      apcStack_480[0] = (code *)0x122d50;
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  apcStack_480[0] = test_bson_utf8_key;
  test_bson_append_deep_cold_1();
  __haystack = apcStack_480;
  pcStack_608 = (code *)0x122d83;
  pbStack_488 = pbVar4;
  apcStack_480[0] = pcVar10;
  pbVar4 = get_bson("eurokey.bson");
  pcStack_608 = (code *)0x122d95;
  cVar1 = bson_validate(pbVar4,0,auStack_588);
  if (cVar1 == '\0') {
    pcStack_608 = (code *)0x122e27;
    test_bson_utf8_key_cold_1();
LAB_00122e27:
    pcStack_608 = (code *)0x122e2c;
    test_bson_utf8_key_cold_2();
LAB_00122e2c:
    pcStack_608 = (code *)0x122e31;
    test_bson_utf8_key_cold_3();
LAB_00122e31:
    pcStack_608 = (code *)0x122e36;
    test_bson_utf8_key_cold_4();
LAB_00122e36:
    pcStack_608 = (code *)0x122e3b;
    test_bson_utf8_key_cold_7();
LAB_00122e3b:
    pcStack_608 = (code *)0x122e40;
    test_bson_utf8_key_cold_5();
  }
  else {
    pcStack_608 = (code *)0x122dad;
    cVar1 = bson_iter_init(auStack_580,pbVar4);
    if (cVar1 == '\0') goto LAB_00122e27;
    pcStack_608 = (code *)0x122dbe;
    cVar1 = bson_iter_next(auStack_580);
    if (cVar1 == '\0') goto LAB_00122e2c;
    pcStack_608 = (code *)0x122dcf;
    pcVar15 = (char *)bson_iter_key(auStack_580);
    pcStack_608 = (code *)0x122dde;
    iVar2 = strcmp(pcVar15,anon_var_dwarf_49b7);
    if (iVar2 != 0) goto LAB_00122e31;
    pcStack_608 = (code *)0x122df4;
    pcVar15 = (char *)bson_iter_utf8(auStack_580,&iStack_58c);
    if (pcVar15 == (char *)0x0) goto LAB_00122e36;
    if (iStack_58c != 0xf) goto LAB_00122e3b;
    pcStack_608 = (code *)0x122e0f;
    iVar2 = strcmp(pcVar15,anon_var_dwarf_49b7);
    if (iVar2 == 0) {
      pcStack_608 = (code *)0x122e1b;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_608 = test_bson_validate;
  test_bson_utf8_key_cold_6();
  pcStack_618 = "a";
  pbVar6 = (bson_t *)0x1;
  pcVar5 = "test%u.bson";
  pcVar15 = acStack_678;
  plVar12 = &lStack_880;
  pbStack_630 = pbVar4;
  pcStack_628 = unaff_R12;
  puStack_620 = puVar14;
  pbStack_610 = pbVar3;
  pcStack_608 = (code *)apcStack_480;
  do {
    apcStack_890[0] = (code *)0x122e83;
    bson_snprintf(pcVar15,0x40,"test%u.bson",pbVar6);
    apcStack_890[0] = (code *)0x122e8b;
    pbVar3 = get_bson(pcVar15);
    apcStack_890[0] = (code *)0x122e9b;
    cVar1 = bson_validate(pbVar3,0,plVar12);
    if (cVar1 == '\0') {
      apcStack_890[0] = (code *)0x123ddb;
      test_bson_validate_cold_1();
      goto LAB_00123ddb;
    }
    apcStack_890[0] = (code *)0x122eab;
    bson_destroy(pbVar3);
    uVar9 = (int)pbVar6 + 1;
    pbVar6 = (bson_t *)(ulong)uVar9;
  } while (uVar9 != 0x27);
  apcStack_890[0] = (code *)0x122ebe;
  pbVar6 = get_bson("codewscope.bson");
  apcStack_890[0] = (code *)0x122ed0;
  cVar1 = bson_validate(pbVar6,0,&lStack_880);
  if (cVar1 == '\0') {
LAB_00123ddb:
    apcStack_890[0] = (code *)0x123de0;
    test_bson_validate_cold_2();
LAB_00123de0:
    apcStack_890[0] = (code *)0x123de5;
    test_bson_validate_cold_3();
LAB_00123de5:
    apcStack_890[0] = (code *)0x123dea;
    test_bson_validate_cold_158();
LAB_00123dea:
    apcStack_890[0] = (code *)0x123def;
    test_bson_validate_cold_157();
LAB_00123def:
    apcStack_890[0] = (code *)0x123df4;
    test_bson_validate_cold_155();
LAB_00123df4:
    apcStack_890[0] = (code *)0x123df9;
    test_bson_validate_cold_154();
LAB_00123df9:
    apcStack_890[0] = (code *)0x123dfe;
    test_bson_validate_cold_152();
LAB_00123dfe:
    apcStack_890[0] = (code *)0x123e03;
    test_bson_validate_cold_151();
LAB_00123e03:
    apcStack_890[0] = (code *)0x123e08;
    test_bson_validate_cold_149();
LAB_00123e08:
    apcStack_890[0] = (code *)0x123e0d;
    test_bson_validate_cold_148();
LAB_00123e0d:
    apcStack_890[0] = (code *)0x123e12;
    test_bson_validate_cold_146();
LAB_00123e12:
    apcStack_890[0] = (code *)0x123e17;
    test_bson_validate_cold_145();
LAB_00123e17:
    apcStack_890[0] = (code *)0x123e1c;
    test_bson_validate_cold_143();
LAB_00123e1c:
    apcStack_890[0] = (code *)0x123e21;
    test_bson_validate_cold_142();
LAB_00123e21:
    apcStack_890[0] = (code *)0x123e26;
    test_bson_validate_cold_140();
LAB_00123e26:
    apcStack_890[0] = (code *)0x123e2b;
    test_bson_validate_cold_139();
LAB_00123e2b:
    apcStack_890[0] = (code *)0x123e30;
    test_bson_validate_cold_137();
LAB_00123e30:
    apcStack_890[0] = (code *)0x123e35;
    test_bson_validate_cold_136();
LAB_00123e35:
    apcStack_890[0] = (code *)0x123e3a;
    test_bson_validate_cold_134();
LAB_00123e3a:
    apcStack_890[0] = (code *)0x123e3f;
    test_bson_validate_cold_133();
LAB_00123e3f:
    apcStack_890[0] = (code *)0x123e44;
    test_bson_validate_cold_131();
LAB_00123e44:
    apcStack_890[0] = (code *)0x123e49;
    test_bson_validate_cold_130();
LAB_00123e49:
    apcStack_890[0] = (code *)0x123e4e;
    test_bson_validate_cold_128();
LAB_00123e4e:
    apcStack_890[0] = (code *)0x123e53;
    test_bson_validate_cold_127();
LAB_00123e53:
    apcStack_890[0] = (code *)0x123e58;
    test_bson_validate_cold_125();
LAB_00123e58:
    apcStack_890[0] = (code *)0x123e5d;
    test_bson_validate_cold_124();
LAB_00123e5d:
    apcStack_890[0] = (code *)0x123e62;
    test_bson_validate_cold_122();
LAB_00123e62:
    apcStack_890[0] = (code *)0x123e67;
    test_bson_validate_cold_121();
LAB_00123e67:
    apcStack_890[0] = (code *)0x123e6c;
    test_bson_validate_cold_119();
LAB_00123e6c:
    apcStack_890[0] = (code *)0x123e71;
    test_bson_validate_cold_118();
LAB_00123e71:
    apcStack_890[0] = (code *)0x123e76;
    test_bson_validate_cold_116();
LAB_00123e76:
    apcStack_890[0] = (code *)0x123e7b;
    test_bson_validate_cold_115();
LAB_00123e7b:
    apcStack_890[0] = (code *)0x123e80;
    test_bson_validate_cold_113();
LAB_00123e80:
    apcStack_890[0] = (code *)0x123e85;
    test_bson_validate_cold_112();
LAB_00123e85:
    apcStack_890[0] = (code *)0x123e8a;
    test_bson_validate_cold_110();
LAB_00123e8a:
    apcStack_890[0] = (code *)0x123e8f;
    test_bson_validate_cold_109();
LAB_00123e8f:
    apcStack_890[0] = (code *)0x123e94;
    test_bson_validate_cold_107();
LAB_00123e94:
    apcStack_890[0] = (code *)0x123e99;
    test_bson_validate_cold_106();
LAB_00123e99:
    apcStack_890[0] = (code *)0x123e9e;
    test_bson_validate_cold_104();
LAB_00123e9e:
    apcStack_890[0] = (code *)0x123ea3;
    test_bson_validate_cold_103();
LAB_00123ea3:
    apcStack_890[0] = (code *)0x123ea8;
    test_bson_validate_cold_101();
LAB_00123ea8:
    apcStack_890[0] = (code *)0x123ead;
    test_bson_validate_cold_100();
LAB_00123ead:
    apcStack_890[0] = (code *)0x123eb2;
    test_bson_validate_cold_98();
LAB_00123eb2:
    apcStack_890[0] = (code *)0x123eb7;
    test_bson_validate_cold_97();
LAB_00123eb7:
    apcStack_890[0] = (code *)0x123ebc;
    test_bson_validate_cold_95();
LAB_00123ebc:
    apcStack_890[0] = (code *)0x123ec1;
    test_bson_validate_cold_94();
LAB_00123ec1:
    apcStack_890[0] = (code *)0x123ec6;
    test_bson_validate_cold_92();
LAB_00123ec6:
    apcStack_890[0] = (code *)0x123ecb;
    test_bson_validate_cold_91();
LAB_00123ecb:
    apcStack_890[0] = (code *)0x123ed0;
    test_bson_validate_cold_73();
LAB_00123ed0:
    apcStack_890[0] = (code *)0x123ed5;
    test_bson_validate_cold_74();
LAB_00123ed5:
    apcStack_890[0] = (code *)0x123eda;
    test_bson_validate_cold_75();
LAB_00123eda:
    apcStack_890[0] = (code *)0x123edf;
    test_bson_validate_cold_89();
LAB_00123edf:
    apcStack_890[0] = (code *)0x123ee4;
    test_bson_validate_cold_78();
LAB_00123ee4:
    apcStack_890[0] = (code *)0x123ee9;
    test_bson_validate_cold_87();
LAB_00123ee9:
    apcStack_890[0] = (code *)0x123eee;
    test_bson_validate_cold_81();
LAB_00123eee:
    apcStack_890[0] = (code *)0x123ef3;
    test_bson_validate_cold_85();
    ppcVar11 = __haystack;
LAB_00123ef3:
    apcStack_890[0] = (code *)0x123ef8;
    test_bson_validate_cold_4();
LAB_00123ef8:
    apcStack_890[0] = (code *)0x123efd;
    test_bson_validate_cold_5();
    __haystack = ppcVar11;
LAB_00123efd:
    apcStack_890[0] = (code *)0x123f02;
    test_bson_validate_cold_6();
LAB_00123f02:
    apcStack_890[0] = (code *)0x123f0a;
    test_bson_validate_cold_156();
LAB_00123f0a:
    apcStack_890[0] = (code *)0x123f0f;
    test_bson_validate_cold_7();
LAB_00123f0f:
    apcStack_890[0] = (code *)0x123f14;
    test_bson_validate_cold_8();
LAB_00123f14:
    apcStack_890[0] = (code *)0x123f19;
    test_bson_validate_cold_9();
LAB_00123f19:
    apcStack_890[0] = (code *)0x123f21;
    test_bson_validate_cold_153();
LAB_00123f21:
    apcStack_890[0] = (code *)0x123f26;
    test_bson_validate_cold_10();
LAB_00123f26:
    apcStack_890[0] = (code *)0x123f2b;
    test_bson_validate_cold_11();
LAB_00123f2b:
    apcStack_890[0] = (code *)0x123f30;
    test_bson_validate_cold_12();
LAB_00123f30:
    apcStack_890[0] = (code *)0x123f38;
    test_bson_validate_cold_150();
LAB_00123f38:
    apcStack_890[0] = (code *)0x123f3d;
    test_bson_validate_cold_13();
LAB_00123f3d:
    apcStack_890[0] = (code *)0x123f42;
    test_bson_validate_cold_14();
LAB_00123f42:
    apcStack_890[0] = (code *)0x123f47;
    test_bson_validate_cold_15();
LAB_00123f47:
    apcStack_890[0] = (code *)0x123f4f;
    test_bson_validate_cold_147();
LAB_00123f4f:
    apcStack_890[0] = (code *)0x123f54;
    test_bson_validate_cold_16();
LAB_00123f54:
    apcStack_890[0] = (code *)0x123f59;
    test_bson_validate_cold_17();
LAB_00123f59:
    apcStack_890[0] = (code *)0x123f5e;
    test_bson_validate_cold_18();
LAB_00123f5e:
    apcStack_890[0] = (code *)0x123f66;
    test_bson_validate_cold_144();
LAB_00123f66:
    apcStack_890[0] = (code *)0x123f6b;
    test_bson_validate_cold_19();
LAB_00123f6b:
    apcStack_890[0] = (code *)0x123f70;
    test_bson_validate_cold_20();
LAB_00123f70:
    apcStack_890[0] = (code *)0x123f75;
    test_bson_validate_cold_21();
LAB_00123f75:
    apcStack_890[0] = (code *)0x123f7d;
    test_bson_validate_cold_141();
LAB_00123f7d:
    apcStack_890[0] = (code *)0x123f82;
    test_bson_validate_cold_22();
LAB_00123f82:
    apcStack_890[0] = (code *)0x123f87;
    test_bson_validate_cold_23();
LAB_00123f87:
    apcStack_890[0] = (code *)0x123f8c;
    test_bson_validate_cold_24();
LAB_00123f8c:
    apcStack_890[0] = (code *)0x123f94;
    test_bson_validate_cold_138();
LAB_00123f94:
    apcStack_890[0] = (code *)0x123f99;
    test_bson_validate_cold_25();
LAB_00123f99:
    apcStack_890[0] = (code *)0x123f9e;
    test_bson_validate_cold_26();
LAB_00123f9e:
    apcStack_890[0] = (code *)0x123fa3;
    test_bson_validate_cold_27();
LAB_00123fa3:
    apcStack_890[0] = (code *)0x123fab;
    test_bson_validate_cold_135();
LAB_00123fab:
    apcStack_890[0] = (code *)0x123fb0;
    test_bson_validate_cold_28();
LAB_00123fb0:
    apcStack_890[0] = (code *)0x123fb5;
    test_bson_validate_cold_29();
LAB_00123fb5:
    apcStack_890[0] = (code *)0x123fba;
    test_bson_validate_cold_30();
LAB_00123fba:
    apcStack_890[0] = (code *)0x123fc2;
    test_bson_validate_cold_132();
LAB_00123fc2:
    apcStack_890[0] = (code *)0x123fc7;
    test_bson_validate_cold_31();
LAB_00123fc7:
    apcStack_890[0] = (code *)0x123fcc;
    test_bson_validate_cold_32();
LAB_00123fcc:
    apcStack_890[0] = (code *)0x123fd1;
    test_bson_validate_cold_33();
LAB_00123fd1:
    apcStack_890[0] = (code *)0x123fd9;
    test_bson_validate_cold_129();
LAB_00123fd9:
    apcStack_890[0] = (code *)0x123fde;
    test_bson_validate_cold_34();
LAB_00123fde:
    apcStack_890[0] = (code *)0x123fe3;
    test_bson_validate_cold_35();
LAB_00123fe3:
    apcStack_890[0] = (code *)0x123fe8;
    test_bson_validate_cold_36();
LAB_00123fe8:
    apcStack_890[0] = (code *)0x123ff0;
    test_bson_validate_cold_126();
LAB_00123ff0:
    apcStack_890[0] = (code *)0x123ff5;
    test_bson_validate_cold_37();
LAB_00123ff5:
    apcStack_890[0] = (code *)0x123ffa;
    test_bson_validate_cold_38();
LAB_00123ffa:
    apcStack_890[0] = (code *)0x123fff;
    test_bson_validate_cold_39();
LAB_00123fff:
    apcStack_890[0] = (code *)0x124007;
    test_bson_validate_cold_123();
LAB_00124007:
    apcStack_890[0] = (code *)0x12400c;
    test_bson_validate_cold_40();
LAB_0012400c:
    apcStack_890[0] = (code *)0x124011;
    test_bson_validate_cold_41();
LAB_00124011:
    apcStack_890[0] = (code *)0x124016;
    test_bson_validate_cold_42();
LAB_00124016:
    apcStack_890[0] = (code *)0x12401e;
    test_bson_validate_cold_120();
LAB_0012401e:
    apcStack_890[0] = (code *)0x124023;
    test_bson_validate_cold_43();
LAB_00124023:
    apcStack_890[0] = (code *)0x124028;
    test_bson_validate_cold_44();
LAB_00124028:
    apcStack_890[0] = (code *)0x12402d;
    test_bson_validate_cold_45();
LAB_0012402d:
    apcStack_890[0] = (code *)0x124035;
    test_bson_validate_cold_117();
LAB_00124035:
    apcStack_890[0] = (code *)0x12403a;
    test_bson_validate_cold_46();
LAB_0012403a:
    apcStack_890[0] = (code *)0x12403f;
    test_bson_validate_cold_47();
LAB_0012403f:
    apcStack_890[0] = (code *)0x124044;
    test_bson_validate_cold_48();
LAB_00124044:
    apcStack_890[0] = (code *)0x12404c;
    test_bson_validate_cold_114();
LAB_0012404c:
    apcStack_890[0] = (code *)0x124051;
    test_bson_validate_cold_49();
LAB_00124051:
    apcStack_890[0] = (code *)0x124056;
    test_bson_validate_cold_50();
LAB_00124056:
    apcStack_890[0] = (code *)0x12405b;
    test_bson_validate_cold_51();
LAB_0012405b:
    apcStack_890[0] = (code *)0x124063;
    test_bson_validate_cold_111();
LAB_00124063:
    apcStack_890[0] = (code *)0x124068;
    test_bson_validate_cold_52();
LAB_00124068:
    apcStack_890[0] = (code *)0x12406d;
    test_bson_validate_cold_53();
LAB_0012406d:
    apcStack_890[0] = (code *)0x124072;
    test_bson_validate_cold_54();
LAB_00124072:
    apcStack_890[0] = (code *)0x12407a;
    test_bson_validate_cold_108();
LAB_0012407a:
    apcStack_890[0] = (code *)0x12407f;
    test_bson_validate_cold_55();
LAB_0012407f:
    apcStack_890[0] = (code *)0x124084;
    test_bson_validate_cold_56();
LAB_00124084:
    apcStack_890[0] = (code *)0x124089;
    test_bson_validate_cold_57();
LAB_00124089:
    apcStack_890[0] = (code *)0x124091;
    test_bson_validate_cold_105();
LAB_00124091:
    apcStack_890[0] = (code *)0x124096;
    test_bson_validate_cold_58();
LAB_00124096:
    apcStack_890[0] = (code *)0x12409b;
    test_bson_validate_cold_59();
LAB_0012409b:
    apcStack_890[0] = (code *)0x1240a0;
    test_bson_validate_cold_60();
LAB_001240a0:
    apcStack_890[0] = (code *)0x1240a8;
    test_bson_validate_cold_102();
LAB_001240a8:
    apcStack_890[0] = (code *)0x1240ad;
    test_bson_validate_cold_61();
LAB_001240ad:
    apcStack_890[0] = (code *)0x1240b2;
    test_bson_validate_cold_62();
LAB_001240b2:
    apcStack_890[0] = (code *)0x1240b7;
    test_bson_validate_cold_63();
LAB_001240b7:
    apcStack_890[0] = (code *)0x1240bf;
    test_bson_validate_cold_99();
LAB_001240bf:
    apcStack_890[0] = (code *)0x1240c4;
    test_bson_validate_cold_64();
LAB_001240c4:
    apcStack_890[0] = (code *)0x1240c9;
    test_bson_validate_cold_65();
LAB_001240c9:
    apcStack_890[0] = (code *)0x1240ce;
    test_bson_validate_cold_66();
LAB_001240ce:
    apcStack_890[0] = (code *)0x1240d6;
    test_bson_validate_cold_96();
LAB_001240d6:
    apcStack_890[0] = (code *)0x1240db;
    test_bson_validate_cold_67();
LAB_001240db:
    apcStack_890[0] = (code *)0x1240e0;
    test_bson_validate_cold_68();
LAB_001240e0:
    apcStack_890[0] = (code *)0x1240e5;
    test_bson_validate_cold_69();
LAB_001240e5:
    apcStack_890[0] = (code *)0x1240ed;
    test_bson_validate_cold_93();
LAB_001240ed:
    apcStack_890[0] = (code *)0x1240f2;
    test_bson_validate_cold_70();
LAB_001240f2:
    apcStack_890[0] = (code *)0x1240f7;
    test_bson_validate_cold_71();
LAB_001240f7:
    apcStack_890[0] = (code *)0x1240fc;
    test_bson_validate_cold_72();
LAB_001240fc:
    apcStack_890[0] = (code *)0x124104;
    test_bson_validate_cold_90();
LAB_00124104:
    apcStack_890[0] = (code *)0x124109;
    test_bson_validate_cold_76();
LAB_00124109:
    apcStack_890[0] = (code *)0x12410e;
    test_bson_validate_cold_77();
LAB_0012410e:
    apcStack_890[0] = (code *)0x124116;
    test_bson_validate_cold_88();
LAB_00124116:
    apcStack_890[0] = (code *)0x12411b;
    test_bson_validate_cold_79();
LAB_0012411b:
    apcStack_890[0] = (code *)0x124120;
    test_bson_validate_cold_80();
LAB_00124120:
    apcStack_890[0] = (code *)0x124128;
    test_bson_validate_cold_86();
LAB_00124128:
    apcStack_890[0] = (code *)0x12412d;
    test_bson_validate_cold_82();
LAB_0012412d:
    apcStack_890[0] = (code *)0x124132;
    test_bson_validate_cold_83();
  }
  else {
    apcStack_890[0] = (code *)0x122ee0;
    bson_destroy(pbVar6);
    apcStack_890[0] = (code *)0x122eec;
    pbVar6 = get_bson("empty_key.bson");
    apcStack_890[0] = (code *)0x122f01;
    cVar1 = bson_validate(pbVar6,7,&lStack_880);
    if (cVar1 == '\0') goto LAB_00123de0;
    apcStack_890[0] = (code *)0x122f11;
    bson_destroy(pbVar6);
    apcStack_890[0] = (code *)0x122f1d;
    pcVar5 = (char *)get_bson("overflow2.bson");
    apcStack_890[0] = (code *)0x122f2f;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123de5;
    ppcVar11 = apcStack_480;
    if (lStack_880 != 9) goto LAB_00123ef3;
    apcStack_890[0] = (code *)0x122f55;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123dea;
    ppcVar11 = apcStack_480;
    if (iStack_878 != 3) goto LAB_00123ef8;
    __haystack = apcStack_480;
    if (iStack_874 != 0) goto LAB_00123efd;
    __haystack = (code **)auStack_870;
    apcStack_890[0] = (code *)0x122f8a;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123f02;
    apcStack_890[0] = (code *)0x122f9b;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x122fa7;
    pcVar5 = (char *)get_bson("trailingnull.bson");
    apcStack_890[0] = (code *)0x122fb9;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123def;
    if (lStack_880 != 0xe) goto LAB_00123f0a;
    apcStack_890[0] = (code *)0x122fdf;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123df4;
    if (iStack_878 != 3) goto LAB_00123f0f;
    if (iStack_874 != 0) goto LAB_00123f14;
    apcStack_890[0] = (code *)0x12300f;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123f19;
    apcStack_890[0] = (code *)0x123020;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12302c;
    pcVar5 = (char *)get_bson("dollarquery.bson");
    apcStack_890[0] = (code *)0x123041;
    cVar1 = bson_validate(pcVar5,6,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123df9;
    if (lStack_880 != 4) goto LAB_00123f21;
    apcStack_890[0] = (code *)0x12306a;
    cVar1 = bson_validate_with_error(pcVar5,6,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123dfe;
    if (iStack_878 != 3) goto LAB_00123f26;
    if (iStack_874 != 2) goto LAB_00123f2b;
    apcStack_890[0] = (code *)0x12309b;
    pcVar7 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$query\"");
    if (pcVar7 == (char *)0x0) goto LAB_00123f30;
    apcStack_890[0] = (code *)0x1230ac;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1230b8;
    pcVar5 = (char *)get_bson("dotquery.bson");
    apcStack_890[0] = (code *)0x1230cd;
    cVar1 = bson_validate(pcVar5,6,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e03;
    if (lStack_880 != 4) goto LAB_00123f38;
    apcStack_890[0] = (code *)0x1230f6;
    cVar1 = bson_validate_with_error(pcVar5,6,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e08;
    if (iStack_878 != 3) goto LAB_00123f3d;
    if (iStack_874 != 4) goto LAB_00123f42;
    apcStack_890[0] = (code *)0x123127;
    pcVar7 = strstr((char *)__haystack,"keys cannot contain \".\": \"abc.def\"");
    if (pcVar7 == (char *)0x0) goto LAB_00123f47;
    apcStack_890[0] = (code *)0x123138;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123144;
    pcVar5 = (char *)get_bson("overflow3.bson");
    apcStack_890[0] = (code *)0x123156;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e0d;
    if (lStack_880 != 9) goto LAB_00123f4f;
    apcStack_890[0] = (code *)0x12317c;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e12;
    if (iStack_878 != 3) goto LAB_00123f54;
    if (iStack_874 != 0) goto LAB_00123f59;
    apcStack_890[0] = (code *)0x1231ac;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123f5e;
    apcStack_890[0] = (code *)0x1231bd;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1231c9;
    pcVar5 = (char *)get_bson("overflow3.bson");
    apcStack_890[0] = (code *)0x1231de;
    cVar1 = bson_validate(pcVar5,1,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e17;
    if (lStack_880 != 9) goto LAB_00123f66;
    apcStack_890[0] = (code *)0x123207;
    cVar1 = bson_validate_with_error(pcVar5,1,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e1c;
    if (iStack_878 != 3) goto LAB_00123f6b;
    if (iStack_874 != 0) goto LAB_00123f70;
    apcStack_890[0] = (code *)0x123237;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123f75;
    apcStack_890[0] = (code *)0x123248;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123254;
    pcVar5 = (char *)get_bson("overflow4.bson");
    apcStack_890[0] = (code *)0x123266;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e21;
    if (lStack_880 != 9) goto LAB_00123f7d;
    apcStack_890[0] = (code *)0x12328c;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e26;
    if (iStack_878 != 3) goto LAB_00123f82;
    if (iStack_874 != 0) goto LAB_00123f87;
    apcStack_890[0] = (code *)0x1232bc;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123f8c;
    apcStack_890[0] = (code *)0x1232cd;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1232d9;
    pcVar5 = (char *)get_bson("empty_key.bson");
    apcStack_890[0] = (code *)0x1232ee;
    cVar1 = bson_validate(pcVar5,0x10,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e2b;
    if (lStack_880 != 4) goto LAB_00123f94;
    apcStack_890[0] = (code *)0x123317;
    cVar1 = bson_validate_with_error(pcVar5,0x10,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e30;
    if (iStack_878 != 3) goto LAB_00123f99;
    if (iStack_874 != 0x10) goto LAB_00123f9e;
    apcStack_890[0] = (code *)0x123348;
    pcVar7 = strstr((char *)__haystack,"empty key");
    if (pcVar7 == (char *)0x0) goto LAB_00123fa3;
    apcStack_890[0] = (code *)0x123359;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123365;
    pcVar5 = (char *)get_bson("test40.bson");
    apcStack_890[0] = (code *)0x123377;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e35;
    if (lStack_880 != 6) goto LAB_00123fab;
    apcStack_890[0] = (code *)0x12339d;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e3a;
    if (iStack_878 != 3) goto LAB_00123fb0;
    if (iStack_874 != 0) goto LAB_00123fb5;
    apcStack_890[0] = (code *)0x1233cd;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123fba;
    apcStack_890[0] = (code *)0x1233de;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1233ea;
    pcVar5 = (char *)get_bson("test41.bson");
    apcStack_890[0] = (code *)0x1233fc;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e3f;
    if (lStack_880 != 6) goto LAB_00123fc2;
    apcStack_890[0] = (code *)0x123422;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e44;
    if (iStack_878 != 3) goto LAB_00123fc7;
    if (iStack_874 != 0) goto LAB_00123fcc;
    apcStack_890[0] = (code *)0x123452;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123fd1;
    apcStack_890[0] = (code *)0x123463;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12346f;
    pcVar5 = (char *)get_bson("test42.bson");
    apcStack_890[0] = (code *)0x123481;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e49;
    if (lStack_880 != 6) goto LAB_00123fd9;
    apcStack_890[0] = (code *)0x1234a7;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e4e;
    if (iStack_878 != 3) goto LAB_00123fde;
    if (iStack_874 != 0) goto LAB_00123fe3;
    apcStack_890[0] = (code *)0x1234d7;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123fe8;
    apcStack_890[0] = (code *)0x1234e8;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1234f4;
    pcVar5 = (char *)get_bson("test43.bson");
    apcStack_890[0] = (code *)0x123506;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e53;
    if (lStack_880 != 6) goto LAB_00123ff0;
    apcStack_890[0] = (code *)0x12352c;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e58;
    if (iStack_878 != 3) goto LAB_00123ff5;
    if (iStack_874 != 0) goto LAB_00123ffa;
    apcStack_890[0] = (code *)0x12355c;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00123fff;
    apcStack_890[0] = (code *)0x12356d;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123579;
    pcVar5 = (char *)get_bson("test44.bson");
    apcStack_890[0] = (code *)0x12358b;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e5d;
    if (lStack_880 != 6) goto LAB_00124007;
    apcStack_890[0] = (code *)0x1235b1;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e62;
    if (iStack_878 != 3) goto LAB_0012400c;
    if (iStack_874 != 0) goto LAB_00124011;
    apcStack_890[0] = (code *)0x1235e1;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00124016;
    apcStack_890[0] = (code *)0x1235f2;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1235fe;
    pcVar5 = (char *)get_bson("test45.bson");
    apcStack_890[0] = (code *)0x123610;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e67;
    if (lStack_880 != 6) goto LAB_0012401e;
    apcStack_890[0] = (code *)0x123636;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e6c;
    if (iStack_878 != 3) goto LAB_00124023;
    if (iStack_874 != 0) goto LAB_00124028;
    apcStack_890[0] = (code *)0x123666;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_0012402d;
    apcStack_890[0] = (code *)0x123677;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123683;
    pcVar5 = (char *)get_bson("test46.bson");
    apcStack_890[0] = (code *)0x123695;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e71;
    if (lStack_880 != 6) goto LAB_00124035;
    apcStack_890[0] = (code *)0x1236bb;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e76;
    if (iStack_878 != 3) goto LAB_0012403a;
    if (iStack_874 != 0) goto LAB_0012403f;
    apcStack_890[0] = (code *)0x1236eb;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00124044;
    apcStack_890[0] = (code *)0x1236fc;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123708;
    pcVar5 = (char *)get_bson("test47.bson");
    apcStack_890[0] = (code *)0x12371a;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e7b;
    if (lStack_880 != 6) goto LAB_0012404c;
    apcStack_890[0] = (code *)0x123740;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e80;
    if (iStack_878 != 3) goto LAB_00124051;
    if (iStack_874 != 0) goto LAB_00124056;
    apcStack_890[0] = (code *)0x123770;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_0012405b;
    apcStack_890[0] = (code *)0x123781;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12378d;
    pcVar5 = (char *)get_bson("test48.bson");
    apcStack_890[0] = (code *)0x12379f;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e85;
    if (lStack_880 != 6) goto LAB_00124063;
    apcStack_890[0] = (code *)0x1237c5;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e8a;
    if (iStack_878 != 3) goto LAB_00124068;
    if (iStack_874 != 0) goto LAB_0012406d;
    apcStack_890[0] = (code *)0x1237f5;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00124072;
    apcStack_890[0] = (code *)0x123806;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123812;
    pcVar5 = (char *)get_bson("test49.bson");
    apcStack_890[0] = (code *)0x123824;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e8f;
    if (lStack_880 != 6) goto LAB_0012407a;
    apcStack_890[0] = (code *)0x12384a;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e94;
    if (iStack_878 != 3) goto LAB_0012407f;
    if (iStack_874 != 0) goto LAB_00124084;
    apcStack_890[0] = (code *)0x12387a;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_00124089;
    apcStack_890[0] = (code *)0x12388b;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123897;
    pcVar5 = (char *)get_bson("test50.bson");
    apcStack_890[0] = (code *)0x1238a9;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e99;
    if (lStack_880 != 10) goto LAB_00124091;
    apcStack_890[0] = (code *)0x1238cf;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e9e;
    if (iStack_878 != 3) goto LAB_00124096;
    if (iStack_874 != 0) goto LAB_0012409b;
    apcStack_890[0] = (code *)0x1238ff;
    pcVar7 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar7 == (char *)0x0) goto LAB_001240a0;
    apcStack_890[0] = (code *)0x123910;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12391c;
    pcVar5 = (char *)get_bson("test51.bson");
    apcStack_890[0] = (code *)0x12392e;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123ea3;
    if (lStack_880 != 10) goto LAB_001240a8;
    apcStack_890[0] = (code *)0x123954;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123ea8;
    if (iStack_878 != 3) goto LAB_001240ad;
    if (iStack_874 != 0) goto LAB_001240b2;
    apcStack_890[0] = (code *)0x123984;
    pcVar7 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar7 == (char *)0x0) goto LAB_001240b7;
    apcStack_890[0] = (code *)0x123995;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1239a1;
    pcVar5 = (char *)get_bson("test52.bson");
    apcStack_890[0] = (code *)0x1239b3;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123ead;
    if (lStack_880 != 9) goto LAB_001240bf;
    apcStack_890[0] = (code *)0x1239d9;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123eb2;
    if (iStack_878 != 3) goto LAB_001240c4;
    if (iStack_874 != 0) goto LAB_001240c9;
    apcStack_890[0] = (code *)0x123a09;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_001240ce;
    apcStack_890[0] = (code *)0x123a1a;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123a26;
    pcVar5 = (char *)get_bson("test53.bson");
    apcStack_890[0] = (code *)0x123a38;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123eb7;
    if (lStack_880 != 6) goto LAB_001240d6;
    apcStack_890[0] = (code *)0x123a5e;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123ebc;
    if (iStack_878 != 3) goto LAB_001240db;
    if (iStack_874 != 0) goto LAB_001240e0;
    apcStack_890[0] = (code *)0x123a8e;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_001240e5;
    apcStack_890[0] = (code *)0x123a9f;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123aab;
    pcVar5 = (char *)get_bson("test54.bson");
    apcStack_890[0] = (code *)0x123abd;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123ec1;
    if (lStack_880 != 0xc) goto LAB_001240ed;
    apcStack_890[0] = (code *)0x123ae3;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123ec6;
    if (iStack_878 != 3) goto LAB_001240f2;
    if (iStack_874 != 0) goto LAB_001240f7;
    apcStack_890[0] = (code *)0x123b13;
    pcVar7 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar7 == (char *)0x0) goto LAB_001240fc;
    apcStack_890[0] = (code *)0x123b24;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123b29;
    pcVar5 = (char *)bson_bcon_magic();
    pbVar6 = (bson_t *)0x148ce7;
    plVar12 = (long *)0x148f98;
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x148ce7;
    pbStack_8a8 = (bson_t *)0x1;
    plStack_8b0 = (long *)0xf;
    pcStack_8c0 = "$id";
    pcStack_8c8 = "collection";
    uStack_8d0 = 0x123b79;
    pbStack_8b8 = (bson_t *)pcVar5;
    pcVar15 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar5,0);
    apcStack_890[0] = (code *)0x123b8f;
    cVar1 = bson_validate_with_error(pcVar15,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123ecb;
    apcStack_890[0] = (code *)0x123ba9;
    cVar1 = bson_validate_with_error(pcVar15,2,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123ed0;
    apcStack_890[0] = (code *)0x123bb9;
    bson_destroy(pcVar15);
    pcVar15 = "$id";
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x148ce7;
    pbStack_8a8 = (bson_t *)0x1;
    plStack_8b0 = (long *)0x123bec;
    pbVar3 = (bson_t *)bcon_new(0,"my_dbref","{","$id",pcVar5,0xf);
    apcStack_890[0] = (code *)0x123c02;
    cVar1 = bson_validate_with_error(pbVar3,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123ed5;
    apcStack_890[0] = (code *)0x123c1c;
    cVar1 = bson_validate_with_error(pbVar3,2,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123eda;
    if (iStack_878 != 3) goto LAB_00124104;
    if (iStack_874 != 2) goto LAB_00124109;
    apcStack_890[0] = (code *)0x123c4d;
    pcVar7 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$id\"");
    if (pcVar7 == (char *)0x0) goto LAB_0012410e;
    apcStack_890[0] = (code *)0x123c5e;
    bson_destroy(pbVar3);
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x148ce7;
    pbVar3 = (bson_t *)0x145c6e;
    pbStack_8a8 = (bson_t *)0x145c6e;
    plStack_8b0 = (long *)0x0;
    pcStack_8c0 = "$ref";
    pcStack_8c8 = "collection";
    uStack_8d0 = 0x123c96;
    pbStack_8b8 = (bson_t *)pcVar5;
    plVar12 = (long *)bcon_new(0,"my_dbref","{","$ref",pcVar5,0);
    apcStack_890[0] = (code *)0x123cac;
    cVar1 = bson_validate_with_error(plVar12,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123edf;
    apcStack_890[0] = (code *)0x123cc6;
    cVar1 = bson_validate_with_error(plVar12,2,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123ee4;
    if (iStack_878 != 3) goto LAB_00124116;
    if (iStack_874 != 2) goto LAB_0012411b;
    apcStack_890[0] = (code *)0x123cf7;
    pcVar7 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$ref\"");
    if (pcVar7 == (char *)0x0) goto LAB_00124120;
    apcStack_890[0] = (code *)0x123d08;
    bson_destroy(plVar12);
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x148ce7;
    pbStack_8a8 = (bson_t *)0x1;
    plStack_8b0 = (long *)0xf;
    pcStack_8c0 = "$id";
    pcStack_8c8 = (char *)0x2;
    uStack_8d0 = 0xf;
    pcStack_8e0 = "extra";
    pcStack_8e8 = "collection";
    uStack_8f0 = 0x123d52;
    pbStack_8d8 = (bson_t *)pcVar5;
    pbStack_8b8 = (bson_t *)pcVar5;
    pcVar5 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar5,0);
    apcStack_890[0] = (code *)0x123d68;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123ee9;
    apcStack_890[0] = (code *)0x123d82;
    cVar1 = bson_validate_with_error(pcVar5,2,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123eee;
    if (iStack_878 != 3) goto LAB_00124128;
    if (iStack_874 != 2) goto LAB_0012412d;
    apcStack_890[0] = (code *)0x123db3;
    pcVar7 = strstr((char *)__haystack,"invalid key within DBRef subdocument: \"extra\"");
    if (pcVar7 != (char *)0x0) {
      apcStack_890[0] = (code *)0x123dc4;
      bson_destroy(pcVar5);
      return;
    }
  }
  apcStack_890[0] = test_bson_validate_dbref;
  test_bson_validate_cold_84();
  apcStack_b88[0] = (code *)0x124162;
  pbStack_8b8 = pbVar6;
  plStack_8b0 = plVar12;
  pbStack_8a8 = pbVar3;
  pbStack_8a0 = (bson_t *)pcVar5;
  pcStack_898 = pcVar15;
  apcStack_890[0] = (code *)__haystack;
  bson_init(auStack_b00);
  apcStack_b88[0] = (code *)0x124181;
  bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
  apcStack_b88[0] = (code *)0x1241a2;
  bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
  apcStack_b88[0] = (code *)0x1241ad;
  bson_append_document_end(auStack_b00,auStack_a80);
  apcStack_b88[0] = (code *)0x1241bf;
  cVar1 = bson_validate(auStack_b00,2,auStack_b08);
  if (cVar1 == '\0') {
    apcStack_b88[0] = (code *)0x1241d7;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1241df;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1241fe;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x12421f;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124240;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x12424b;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x12425d;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b32;
    apcStack_b88[0] = (code *)0x124275;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x12427d;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x12429e;
    bson_append_utf8(auStack_b00,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1242bf;
    bson_append_utf8(auStack_b00,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x1242d1;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b37;
    apcStack_b88[0] = (code *)0x1242e9;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1242f1;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124310;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124331;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x124352;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124373;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x12437e;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124390;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b3c;
    apcStack_b88[0] = (code *)0x1243a8;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1243b0;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1243cf;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1243f0;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124411;
    bson_append_utf8(auStack_a80,"$db",3,"bar",3);
    apcStack_b88[0] = (code *)0x12441c;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x12442e;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b41;
    apcStack_b88[0] = (code *)0x124446;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x12444e;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x12446d;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124486;
    bson_append_int32(auStack_a80,"$ref",4,1);
    apcStack_b88[0] = (code *)0x1244a7;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x1244b2;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1244c4;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b46;
    apcStack_b88[0] = (code *)0x1244dc;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1244e4;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124503;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x12451c;
    bson_append_int32(auStack_a80,"$ref",4,1);
    apcStack_b88[0] = (code *)0x124527;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124539;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b4b;
    apcStack_b88[0] = (code *)0x124551;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124559;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124578;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124599;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1245ba;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x1245d3;
    bson_append_int32(auStack_a80,"$db",3,1);
    apcStack_b88[0] = (code *)0x1245de;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1245f0;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b50;
    apcStack_b88[0] = (code *)0x124608;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124610;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x12462f;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124650;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124671;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x12468a;
    bson_append_int32(auStack_a80,"$db",3,1);
    apcStack_b88[0] = (code *)0x1246ab;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x1246b6;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1246c8;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b55;
    apcStack_b88[0] = (code *)0x1246e0;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1246e8;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124707;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124728;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124749;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x12476a;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x12478b;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x124796;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1247a8;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124b5a;
    apcStack_b88[0] = (code *)0x1247c0;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1247c8;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1247e7;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124808;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124829;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124834;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124846;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 == '\0') goto LAB_00124b5f;
    apcStack_b88[0] = (code *)0x12485e;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124866;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124885;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1248a9;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1248cb;
    bson_append_document_begin(auStack_a80,"$id",3,auStack_a00);
    apcStack_b88[0] = (code *)0x1248e8;
    bson_append_utf8(auStack_a00,"$ref",4,"foo2",4);
    apcStack_b88[0] = (code *)0x124905;
    bson_append_utf8(auStack_a00,"$id",3,"bar2",4);
    apcStack_b88[0] = (code *)0x124929;
    bson_append_utf8(auStack_a00,"$db",3,"baz2",4);
    apcStack_b88[0] = (code *)0x124934;
    bson_append_document_end(auStack_a80,auStack_a00);
    apcStack_b88[0] = (code *)0x124951;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x12495c;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x12496e;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 == '\0') goto LAB_00124b64;
    apcStack_b88[0] = (code *)0x124986;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x12498e;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1249ad;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1249ce;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1249ef;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124a10;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x124a1b;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124a2d;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 == '\0') goto LAB_00124b69;
    apcStack_b88[0] = (code *)0x124a45;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124a4d;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124a6c;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124a8d;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124aae;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124acf;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x124af0;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x124afb;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124b0d;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') {
      apcStack_b88[0] = (code *)0x124b1e;
      bson_destroy(auStack_b00);
      return;
    }
  }
  else {
    apcStack_b88[0] = (code *)0x124b32;
    test_bson_validate_dbref_cold_14();
LAB_00124b32:
    apcStack_b88[0] = (code *)0x124b37;
    test_bson_validate_dbref_cold_13();
LAB_00124b37:
    apcStack_b88[0] = (code *)0x124b3c;
    test_bson_validate_dbref_cold_12();
LAB_00124b3c:
    apcStack_b88[0] = (code *)0x124b41;
    test_bson_validate_dbref_cold_11();
LAB_00124b41:
    apcStack_b88[0] = (code *)0x124b46;
    test_bson_validate_dbref_cold_10();
LAB_00124b46:
    apcStack_b88[0] = (code *)0x124b4b;
    test_bson_validate_dbref_cold_9();
LAB_00124b4b:
    apcStack_b88[0] = (code *)0x124b50;
    test_bson_validate_dbref_cold_8();
LAB_00124b50:
    apcStack_b88[0] = (code *)0x124b55;
    test_bson_validate_dbref_cold_7();
LAB_00124b55:
    apcStack_b88[0] = (code *)0x124b5a;
    test_bson_validate_dbref_cold_6();
LAB_00124b5a:
    apcStack_b88[0] = (code *)0x124b5f;
    test_bson_validate_dbref_cold_5();
LAB_00124b5f:
    apcStack_b88[0] = (code *)0x124b64;
    test_bson_validate_dbref_cold_1();
LAB_00124b64:
    apcStack_b88[0] = (code *)0x124b69;
    test_bson_validate_dbref_cold_2();
LAB_00124b69:
    apcStack_b88[0] = (code *)0x124b6e;
    test_bson_validate_dbref_cold_3();
  }
  apcStack_b88[0] = test_bson_validate_bool;
  test_bson_validate_dbref_cold_4();
  _uStack_d90 = 0x100620800000009;
  uStack_d88 = 0;
  lStack_d98 = 0;
  pcStack_e08 = (code *)0x124bb3;
  apcStack_b88[0] = (code *)apcStack_890;
  cVar1 = bson_init_static(auStack_d00,&stack0xfffffffffffff270,9);
  if (cVar1 == '\0') {
    pcStack_e08 = (code *)0x124cb2;
    test_bson_validate_bool_cold_1();
LAB_00124cb2:
    pcStack_e08 = (code *)0x124cb7;
    test_bson_validate_bool_cold_2();
LAB_00124cb7:
    pcStack_e08 = (code *)0x124cbc;
    test_bson_validate_bool_cold_3();
LAB_00124cbc:
    pcStack_e08 = (code *)0x124cc1;
    test_bson_validate_bool_cold_4();
LAB_00124cc1:
    pcStack_e08 = (code *)0x124cc6;
    test_bson_validate_bool_cold_5();
LAB_00124cc6:
    pcStack_e08 = (code *)0x124ccb;
    test_bson_validate_bool_cold_6();
LAB_00124ccb:
    pcStack_e08 = (code *)0x124cd0;
    test_bson_validate_bool_cold_7();
LAB_00124cd0:
    pcStack_e08 = (code *)0x124cd5;
    test_bson_validate_bool_cold_8();
LAB_00124cd5:
    pcStack_e08 = (code *)0x124cda;
    test_bson_validate_bool_cold_12();
LAB_00124cda:
    pcStack_e08 = (code *)0x124cdf;
    test_bson_validate_bool_cold_10();
LAB_00124cdf:
    pcStack_e08 = (code *)0x124ce4;
    test_bson_validate_bool_cold_11();
  }
  else {
    pcStack_e08 = (code *)0x124bcf;
    cVar1 = bson_validate(auStack_d00,0,&lStack_d98);
    if (cVar1 == '\0') goto LAB_00124cb2;
    pcStack_e08 = (code *)0x124bec;
    cVar1 = bson_iter_init(auStack_d80,auStack_d00);
    if (cVar1 == '\0') goto LAB_00124cb7;
    pcStack_e08 = (code *)0x124c01;
    cVar1 = bson_iter_next(auStack_d80);
    if (cVar1 == '\0') goto LAB_00124cbc;
    pcStack_e08 = (code *)0x124c16;
    iVar2 = bson_iter_type(auStack_d80);
    if (iVar2 != 8) goto LAB_00124cc1;
    pcStack_e08 = (code *)0x124c2c;
    cVar1 = bson_iter_bool(auStack_d80);
    if (cVar1 == '\0') goto LAB_00124cc6;
    if (cStack_d89 != '\x01') goto LAB_00124ccb;
    _uStack_d90 = CONCAT17(0xff,uStack_d90);
    pcStack_e08 = (code *)0x124c5a;
    cVar1 = bson_init_static(auStack_d00,&stack0xfffffffffffff270,9);
    if (cVar1 == '\0') goto LAB_00124cd0;
    pcStack_e08 = (code *)0x124c72;
    cVar1 = bson_validate(auStack_d00,0,&lStack_d98);
    if (cVar1 != '\0') goto LAB_00124cd5;
    if (lStack_d98 == 7) {
      pcStack_e08 = (code *)0x124c93;
      cVar1 = bson_iter_init(auStack_d80,auStack_d00);
      if (cVar1 == '\0') goto LAB_00124cda;
      pcStack_e08 = (code *)0x124ca4;
      cVar1 = bson_iter_next(auStack_d80);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124cdf;
    }
  }
  pcStack_e08 = test_bson_validate_dbpointer;
  test_bson_validate_bool_cold_9();
  uStack_1010 = 0xe072;
  uStack_100e = 0x614171c4e917c9;
  uStack_1020 = 0x1a;
  uStack_101c = 0x200610c;
  uStack_1018 = 0;
  uStack_1016 = 0x6200;
  uStack_1014 = 0xfce15600;
  lStack_1040 = 0;
  puStack_e10 = auStack_b00;
  pcStack_e08 = (code *)apcStack_b88;
  cVar1 = bson_init_static(auStack_f80,&uStack_1020,0x1a);
  if (cVar1 == '\0') {
    test_bson_validate_dbpointer_cold_1();
LAB_00124e6a:
    test_bson_validate_dbpointer_cold_2();
LAB_00124e6f:
    test_bson_validate_dbpointer_cold_3();
LAB_00124e74:
    test_bson_validate_dbpointer_cold_4();
LAB_00124e79:
    test_bson_validate_dbpointer_cold_5();
LAB_00124e7e:
    test_bson_validate_dbpointer_cold_8();
LAB_00124e83:
    test_bson_validate_dbpointer_cold_9();
LAB_00124e88:
    test_bson_validate_dbpointer_cold_13();
LAB_00124e8d:
    test_bson_validate_dbpointer_cold_11();
LAB_00124e92:
    test_bson_validate_dbpointer_cold_12();
LAB_00124e97:
    test_bson_validate_dbpointer_cold_7();
  }
  else {
    cVar1 = bson_validate(auStack_f80,0,&lStack_1040);
    if (cVar1 == '\0') goto LAB_00124e6a;
    cVar1 = bson_iter_init(auStack_1000,auStack_f80);
    if (cVar1 == '\0') goto LAB_00124e6f;
    cVar1 = bson_iter_next(auStack_1000);
    if (cVar1 == '\0') goto LAB_00124e74;
    iVar2 = bson_iter_type(auStack_1000);
    if (iVar2 != 0xc) goto LAB_00124e79;
    bson_iter_dbpointer(auStack_1000,&iStack_1034,&pcStack_1028,auStack_1030);
    if (pcStack_1028 != "b") {
      iVar2 = strcmp(pcStack_1028,"b");
      if (iVar2 != 0) goto LAB_00124ea1;
    }
    if (iStack_1034 != 1) goto LAB_00124e97;
    if ((char)uStack_1014 != '\0') goto LAB_00124e7e;
    uStack_1014 = CONCAT31(uStack_1014._1_3_,0xff);
    cVar1 = bson_init_static(auStack_f80,&uStack_1020,0x1a);
    if (cVar1 == '\0') goto LAB_00124e83;
    cVar1 = bson_validate(auStack_f80,0,&lStack_1040);
    if (cVar1 != '\0') goto LAB_00124e88;
    if (lStack_1040 == 0xc) {
      cVar1 = bson_iter_init(auStack_1000,auStack_f80);
      if (cVar1 == '\0') goto LAB_00124e8d;
      cVar1 = bson_iter_next(auStack_1000);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124e92;
    }
  }
  test_bson_validate_dbpointer_cold_10();
LAB_00124ea1:
  test_bson_validate_dbpointer_cold_6();
  iVar2 = 1000000;
  do {
    uVar8 = bson_new();
    bson_destroy(uVar8);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void
test_bson_append_int32 (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_int32 (b, "a", -1, -123));
   BSON_ASSERT (bson_append_int32 (b, "c", -1, 0));
   BSON_ASSERT (bson_append_int32 (b, "b", -1, 123));
   b2 = get_bson ("test33.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}